

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uenum.cpp
# Opt level: O1

UChar * uenum_unext_63(UEnumeration *en,int32_t *resultLength,UErrorCode *status)

{
  UChar *pUVar1;
  
  if ((en != (UEnumeration *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (en->uNext != (UEnumUNext *)0x0) {
      pUVar1 = (*en->uNext)(en,resultLength,status);
      return pUVar1;
    }
    *status = U_UNSUPPORTED_ERROR;
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI const UChar* U_EXPORT2
uenum_unext(UEnumeration* en,
            int32_t* resultLength,
            UErrorCode* status)
{
    if (!en || U_FAILURE(*status)) {
        return NULL;
    }
    if (en->uNext != NULL) {
        return en->uNext(en, resultLength, status);
    } else {
        *status = U_UNSUPPORTED_ERROR;
        return NULL;
    }
}